

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O2

void __thiscall KDReports::ReportPrivate::ensureLayouted(ReportPrivate *this)

{
  int iVar1;
  QDebug *pQVar2;
  qreal qVar3;
  double dVar4;
  QSizeF QVar5;
  QDebug local_48;
  QDebug local_40;
  QSizeF local_38;
  char *local_28;
  char *local_20;
  char *local_18;
  
  if (this->m_pageContentSizeDirty == true) {
    dVar4 = this->m_layoutWidth;
    if (dVar4 <= 0.0) {
      QVar5 = paperSize(this);
      setPaperSizeFromPrinter(this,QVar5);
    }
    else {
      qVar3 = mmToPixels(this->m_marginLeft + this->m_marginRight);
      dVar4 = dVar4 - qVar3;
      QVar5 = layoutAsOnePage(this,dVar4);
      this->m_paperSize = QVar5;
      local_38.ht = 2.5039550333489e-312;
      local_28 = 
      "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
      ;
      local_20 = "void KDReports::ReportPrivate::ensureLayouted()";
      local_18 = "default";
      QMessageLogger::debug();
      pQVar2 = QDebug::operator<<(&local_40,
                                  "setPaperSizeFromPrinter: endless printer. m_layoutWidth=");
      pQVar2 = QDebug::operator<<(pQVar2,this->m_layoutWidth);
      pQVar2 = QDebug::operator<<(pQVar2,"textDocWidth=");
      pQVar2 = QDebug::operator<<(pQVar2,dVar4);
      pQVar2 = QDebug::operator<<(pQVar2,"single page has size");
      local_38.wd = (qreal)pQVar2->stream;
      *(int *)((long)local_38.wd + 0x28) = *(int *)((long)local_38.wd + 0x28) + 1;
      ::operator<<((Stream *)&local_48,&local_38);
      QDebug::operator<<(&local_48,"pixels");
      QDebug::~QDebug(&local_48);
      QDebug::~QDebug((QDebug *)&local_38);
      QDebug::~QDebug(&local_40);
      iVar1 = (*this->m_layout->_vptr_AbstractReportLayout[6])();
      if (iVar1 != 1) {
        qt_assert("m_layout->numberOfPages() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
                  ,0x79);
      }
    }
  }
  (*this->m_layout->_vptr_AbstractReportLayout[0xd])();
  return;
}

Assistant:

void KDReports::ReportPrivate::ensureLayouted()
{
    // We need to do a layout if
    // m_pageContentSizeDirty is true, i.e. page size has changed etc.
    if (m_pageContentSizeDirty) {
        if (!wantEndlessPrinting()) {
            setPaperSizeFromPrinter(paperSize());
        } else {
            // Get the document to fit into one page
            Q_ASSERT(m_layoutWidth != 0);
            qreal textDocWidth = m_layoutWidth - mmToPixels(m_marginLeft + m_marginRight);
            m_paperSize = layoutAsOnePage(textDocWidth);

            qDebug() << "setPaperSizeFromPrinter: endless printer. m_layoutWidth=" << m_layoutWidth << "textDocWidth=" << textDocWidth << "single page has size" << m_paperSize << "pixels";

            /* cppcheck-suppress assertWithSideEffect */
            Q_ASSERT(m_layout->numberOfPages() == 1);
        }
        // at this point m_pageContentSizeDirty has been set to false in all cases
    }

    m_layout->ensureLayouted();
}